

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O0

int __thiscall
EnvironmentNAVXYTHETALATTICE::GetEnvParameter(EnvironmentNAVXYTHETALATTICE *this,char *parameter)

{
  int iVar1;
  ostream *poVar2;
  SBPL_Exception *this_00;
  char *in_RSI;
  long in_RDI;
  stringstream ss;
  string *in_stack_fffffffffffffe08;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  char *local_18;
  uint local_4;
  
  local_18 = in_RSI;
  iVar1 = strcmp(in_RSI,"cost_inscribed_thresh");
  if (iVar1 == 0) {
    local_4 = (uint)*(byte *)(in_RDI + 0x89);
  }
  else {
    iVar1 = strcmp(local_18,"cost_possibly_circumscribed_thresh");
    if (iVar1 == 0) {
      local_4 = *(uint *)(in_RDI + 0x8c);
    }
    else {
      iVar1 = strcmp(local_18,"cost_obsthresh");
      if (iVar1 != 0) {
        std::__cxx11::stringstream::stringstream(local_1a0);
        poVar2 = std::operator<<(local_190,"ERROR: invalid parameter ");
        std::operator<<(poVar2,local_18);
        this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        SBPL_Exception::SBPL_Exception(this_00,in_stack_fffffffffffffe08);
        __cxa_throw(this_00,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
      }
      local_4 = (uint)*(byte *)(in_RDI + 0x88);
    }
  }
  return local_4;
}

Assistant:

int EnvironmentNAVXYTHETALATTICE::GetEnvParameter(const char* parameter)
{
    if (strcmp(parameter, "cost_inscribed_thresh") == 0) {
        return (int)EnvNAVXYTHETALATCfg.cost_inscribed_thresh;
    }
    else if (strcmp(parameter, "cost_possibly_circumscribed_thresh") == 0) {
        return (int)EnvNAVXYTHETALATCfg.cost_possibly_circumscribed_thresh;
    }
    else if (strcmp(parameter, "cost_obsthresh") == 0) {
        return (int)EnvNAVXYTHETALATCfg.obsthresh;
    }
    else {
        std::stringstream ss;
        ss << "ERROR: invalid parameter " << parameter;
        throw SBPL_Exception(ss.str());
    }
}